

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

size_t __thiscall
ON_Write3dmBufferArchive::Internal_WriteOverride
          (ON_Write3dmBufferArchive *this,size_t sz,void *buffer)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (buffer != (void *)0x0 && sz != 0) {
    uVar1 = this->m_sizeof_buffer;
    sVar3 = this->m_buffer_position;
    uVar2 = sz + sVar3;
    if (uVar1 < uVar2) {
      AllocBuffer(this,uVar2);
      uVar1 = this->m_sizeof_buffer;
      sVar3 = this->m_buffer_position;
      uVar2 = sVar3 + sz;
    }
    if (uVar2 <= uVar1) {
      memcpy(this->m_buffer + sVar3,buffer,sz);
      uVar2 = this->m_buffer_position + sz;
      this->m_buffer_position = uVar2;
      if (uVar2 <= this->m_sizeof_archive) {
        return sz;
      }
      this->m_sizeof_archive = uVar2;
      return sz;
    }
  }
  return 0;
}

Assistant:

size_t ON_Write3dmBufferArchive::Internal_WriteOverride( size_t sz, const void* buffer )
{
  if ( sz <= 0 || 0 == buffer )
    return 0;

  if ( m_buffer_position + sz > m_sizeof_buffer )
  {
    AllocBuffer(m_buffer_position + sz);
  }

  if ( m_buffer_position + sz > m_sizeof_buffer )
    return 0;

  memcpy( m_buffer + m_buffer_position, buffer, sz );
  m_buffer_position += sz;
  if ( m_buffer_position > m_sizeof_archive )
    m_sizeof_archive = m_buffer_position;

  return sz;
}